

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

void Bac_ManSetupTypes(char **pNames,char **pSymbs)

{
  char *pcVar1;
  ulong uVar2;
  int i;
  long lVar3;
  Bac_Pair_t *pBVar4;
  
  uVar2 = 1;
  do {
    pBVar4 = s_Types;
    lVar3 = 1;
    do {
      pBVar4 = pBVar4 + 1;
      if (uVar2 == pBVar4->Type) goto LAB_00389bac;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x49);
    lVar3 = -1;
LAB_00389bac:
    pcVar1 = s_Types[(int)lVar3].pSymb;
    pNames[uVar2] = s_Types[(int)lVar3].pName;
    pSymbs[uVar2] = pcVar1;
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x49) {
      return;
    }
  } while( true );
}

Assistant:

void Bac_ManSetupTypes( char ** pNames, char ** pSymbs )
{
    int Type;
    for ( Type = 1; Type < BAC_BOX_UNKNOWN; Type++ )
    {
        int Id = Bac_GetTypeId( (Bac_ObjType_t)Type );
        pNames[Type] = s_Types[Id].pName;
        pSymbs[Type] = s_Types[Id].pSymb;
    }
}